

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::memory::anon_unknown_0::AllocateFreeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,AllocateFreeTestInstance *this)

{
  ostringstream *poVar1;
  ulong *puVar2;
  Order OVar3;
  Context *this_00;
  TestLog *pTVar4;
  unsigned_long *puVar5;
  pointer pcVar6;
  TestStatus *pTVar7;
  VkResult VVar8;
  uint uVar9;
  qpTestResult qVar10;
  DeviceInterface *pDVar11;
  long *plVar12;
  TestError *pTVar13;
  NotSupportedError *this_01;
  long *plVar14;
  long lVar15;
  ulong uVar16;
  unsigned_long uVar17;
  float fVar18;
  VkMemoryHeap memoryHeap;
  VkMemoryType memoryType;
  VkMemoryAllocateInfo alloc;
  ostringstream s;
  allocator_type local_389;
  VkDevice local_388;
  float local_37c;
  VkMemoryHeap local_378;
  long local_368;
  long lStack_360;
  VkMemoryType local_358;
  TestStatus *local_350;
  long *local_348 [2];
  long local_338 [2];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ios_base local_2b0 [264];
  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
  local_1a8 [4];
  ios_base local_138 [264];
  
  this_00 = (this->super_TestInstance).m_context;
  pTVar4 = this_00->m_testCtx->m_log;
  local_388 = Context::getDevice(this_00);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  if (this->m_memoryTypeIndex == 0) {
    poVar1 = (ostringstream *)(local_328 + 8);
    local_328._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Memory allocation count: ",0x19);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_2b0);
    poVar1 = (ostringstream *)(local_328 + 8);
    local_328._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Single allocation size: ",0x18);
    puVar5 = (this->m_config).memorySize.m_ptr;
    if (puVar5 == (unsigned_long *)0x0) {
      local_37c = *(this->m_config).memoryPercentage.m_ptr;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<double>((double)(local_37c * 100.0));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar12 = (long *)std::__cxx11::string::append((char *)local_348);
      local_378.size = (VkDeviceSize)&local_368;
      plVar14 = plVar12 + 2;
      if ((long *)*plVar12 == plVar14) {
        local_368 = *plVar14;
        lStack_360 = plVar12[3];
      }
      else {
        local_368 = *plVar14;
        local_378.size = (VkDeviceSize)*plVar12;
      }
      local_378._8_8_ = plVar12[1];
      *plVar12 = (long)plVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_378.size,local_378._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((long *)local_378.size != &local_368) {
      operator_delete((void *)local_378.size,local_368 + 1);
    }
    if ((puVar5 == (unsigned_long *)0x0) && (local_348[0] != local_338)) {
      operator_delete(local_348[0],local_338[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_2b0);
    OVar3 = (this->m_config).order;
    if (OVar3 == ALLOC_FREE) {
      local_328._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_328 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_328 + 8),"Memory is freed in same order as allocated. ",0x2c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else if (OVar3 == MIXED_ALLOC_FREE) {
      local_328._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_328 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_328 + 8),"Memory is freed right after allocation. ",0x28);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (OVar3 != ALLOC_REVERSE_FREE) goto LAB_0065be92;
      local_328._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_328 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_328 + 8),"Memory is freed in reversed order. ",0x23);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
    std::ios_base::~ios_base(local_2b0);
  }
LAB_0065be92:
  local_358 = (this->m_memoryProperties).memoryTypes[this->m_memoryTypeIndex];
  puVar2 = (ulong *)((long)&(this->m_memoryProperties).memoryHeaps[0].size +
                    ((ulong)local_358 >> 0x1c & 0xfffffffffffffff0));
  local_378.size = *puVar2;
  local_378._8_8_ = puVar2[1];
  puVar5 = (this->m_config).memorySize.m_ptr;
  if (puVar5 == (unsigned_long *)0x0) {
    fVar18 = (float)local_378.size * *(this->m_config).memoryPercentage.m_ptr;
    uVar16 = (ulong)fVar18;
    uVar17 = (long)(fVar18 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16;
  }
  else {
    uVar17 = *puVar5;
  }
  local_328._0_8_ = (TestLog *)0x0;
  local_350 = __return_storage_ptr__;
  std::vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>::
  vector(local_1a8,(ulong)(this->m_config).memoryAllocationCount,(value_type *)local_328,&local_389)
  ;
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Memory type index: ",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  if ((this->m_memoryProperties).memoryHeapCount <= local_358.heapIndex) {
    local_328._0_8_ = (TestLog *)(local_328 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_328,"Invalid heap index defined for memory type.","");
    tcu::ResultCollector::fail(&this->m_result,(string *)local_328);
    if ((TestLog *)local_328._0_8_ != (TestLog *)(local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_,local_318[0]._M_allocated_capacity + 1);
    }
  }
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Memory type: ",0xd);
  ::vk::operator<<((ostream *)poVar1,&local_358);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Memory heap: ",0xd);
  ::vk::operator<<((ostream *)poVar1,&local_378);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  uVar9 = (this->m_config).memoryAllocationCount;
  if (local_378.size < uVar17 * uVar9 * 8) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Memory heap doesn\'t have enough memory.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
               ,0x98);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((this->m_config).order < MIXED_ALLOC_FREE) {
    if (uVar9 == 0) goto LAB_0065c29d;
    uVar16 = 0;
    do {
      local_328._0_4_ = 5;
      local_328._8_8_ = 0;
      local_318[0]._8_4_ = this->m_memoryTypeIndex;
      local_318[0]._0_8_ = uVar17;
      VVar8 = (*pDVar11->_vptr_DeviceInterface[5])
                        (pDVar11,local_388,local_328,0,
                         local_1a8[0].
                         super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar16);
      ::vk::checkResult(VVar8,
                        "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                        ,0xa8);
      if (local_1a8[0].
          super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16].m_internal == 0) {
        pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar13,(char *)0x0,"!!memoryObjects[ndx]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                   ,0xaa);
        __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar16 = uVar16 + 1;
      uVar9 = (this->m_config).memoryAllocationCount;
    } while (uVar16 < uVar9);
    if ((this->m_config).order == ALLOC_FREE) {
      if (uVar9 == 0) goto LAB_0065c29d;
      lVar15 = -8;
      uVar16 = 0;
      do {
        (*pDVar11->_vptr_DeviceInterface[6])
                  (pDVar11,local_388,
                   *(undefined8 *)
                    ((long)&(local_1a8[0].
                             super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->m_internal + lVar15),0);
        *(undefined8 *)
         ((long)&(local_1a8[0].
                  super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->m_internal + lVar15) = 0;
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + -8;
      } while (uVar16 < (this->m_config).memoryAllocationCount);
    }
    else {
      if (uVar9 == 0) goto LAB_0065c29d;
      uVar16 = 0;
      do {
        (*pDVar11->_vptr_DeviceInterface[6])
                  (pDVar11,local_388,
                   local_1a8[0].
                   super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].m_internal,0);
        local_1a8[0].
        super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar16].m_internal = 0;
        uVar16 = uVar16 + 1;
      } while (uVar16 < (this->m_config).memoryAllocationCount);
    }
  }
  else {
    if (uVar9 != 0) {
      uVar16 = 0;
      do {
        local_328._0_4_ = 5;
        local_328._8_8_ = 0;
        local_318[0]._8_4_ = this->m_memoryTypeIndex;
        local_318[0]._0_8_ = uVar17;
        VVar8 = (*pDVar11->_vptr_DeviceInterface[5])
                          (pDVar11,local_388,local_328,0,
                           local_1a8[0].
                           super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar16);
        ::vk::checkResult(VVar8,
                          "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx])"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                          ,0xce);
        if (local_1a8[0].
            super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar16].m_internal == 0) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar13,(char *)0x0,"!!memoryObjects[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                     ,0xcf);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*pDVar11->_vptr_DeviceInterface[6])(pDVar11,local_388);
        local_1a8[0].
        super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar16].m_internal = 0;
        uVar16 = uVar16 + 1;
      } while (uVar16 < (this->m_config).memoryAllocationCount);
      goto LAB_0065c2a2;
    }
LAB_0065c29d:
    if (local_1a8[0].
        super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0065c2b2;
  }
LAB_0065c2a2:
  operator_delete(local_1a8[0].
                  super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_1a8[0].
                        super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_1a8[0].
                        super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
LAB_0065c2b2:
  pTVar7 = local_350;
  uVar9 = this->m_memoryTypeIndex + 1;
  this->m_memoryTypeIndex = uVar9;
  if (uVar9 < (this->m_memoryProperties).memoryTypeCount) {
    tcu::TestStatus::incomplete();
  }
  else {
    qVar10 = tcu::ResultCollector::getResult(&this->m_result);
    pcVar6 = (this->m_result).m_message._M_dataplus._M_p;
    local_328._0_8_ = (TestLog *)(local_328 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_328,pcVar6,pcVar6 + (this->m_result).m_message._M_string_length);
    pTVar7->m_code = qVar10;
    (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar7->m_description,local_328._0_8_,
               (pointer)(local_328._0_8_ + local_328._8_8_));
    if ((TestLog *)local_328._0_8_ != (TestLog *)(local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_,local_318[0]._M_allocated_capacity + 1);
    }
  }
  return pTVar7;
}

Assistant:

tcu::TestStatus AllocateFreeTestInstance::iterate (void)
{
	TestLog&								log					= m_context.getTestContext().getLog();
	const VkDevice							device				= m_context.getDevice();
	const DeviceInterface&					vkd					= m_context.getDeviceInterface();

	DE_ASSERT(m_config.memoryAllocationCount <= MAX_ALLOCATION_COUNT);

	if (m_memoryTypeIndex == 0)
	{
		log << TestLog::Message << "Memory allocation count: " << m_config.memoryAllocationCount << TestLog::EndMessage;
		log << TestLog::Message << "Single allocation size: " << (m_config.memorySize ? de::toString(*m_config.memorySize) : de::toString(100.0f * (*m_config.memoryPercentage)) + " percent of the heap size.") << TestLog::EndMessage;

		if (m_config.order == TestConfig::ALLOC_REVERSE_FREE)
			log << TestLog::Message << "Memory is freed in reversed order. " << TestLog::EndMessage;
		else if (m_config.order == TestConfig::ALLOC_FREE)
			log << TestLog::Message << "Memory is freed in same order as allocated. " << TestLog::EndMessage;
		else if (m_config.order == TestConfig::MIXED_ALLOC_FREE)
			log << TestLog::Message << "Memory is freed right after allocation. " << TestLog::EndMessage;
		else
			DE_FATAL("Unknown allocation order");
	}

	try
	{
		const VkMemoryType		memoryType		= m_memoryProperties.memoryTypes[m_memoryTypeIndex];
		const VkMemoryHeap		memoryHeap		= m_memoryProperties.memoryHeaps[memoryType.heapIndex];

		const VkDeviceSize		allocationSize	= (m_config.memorySize ? *m_config.memorySize : (VkDeviceSize)(*m_config.memoryPercentage * (float)memoryHeap.size));
		vector<VkDeviceMemory>	memoryObjects	(m_config.memoryAllocationCount, (VkDeviceMemory)0);

		log << TestLog::Message << "Memory type index: " << m_memoryTypeIndex << TestLog::EndMessage;

		if (memoryType.heapIndex >= m_memoryProperties.memoryHeapCount)
			m_result.fail("Invalid heap index defined for memory type.");

		{
			log << TestLog::Message << "Memory type: " << memoryType << TestLog::EndMessage;
			log << TestLog::Message << "Memory heap: " << memoryHeap << TestLog::EndMessage;

			if (allocationSize * m_config.memoryAllocationCount * 8 > memoryHeap.size)
				TCU_THROW(NotSupportedError, "Memory heap doesn't have enough memory.");

			try
			{
				if (m_config.order == TestConfig::ALLOC_FREE || m_config.order == TestConfig::ALLOC_REVERSE_FREE)
				{
					for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
					{
						const VkMemoryAllocateInfo alloc =
						{
							VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
							DE_NULL,								// pNext
							allocationSize,							// allocationSize
							m_memoryTypeIndex						// memoryTypeIndex;
						};

						VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx]));

						TCU_CHECK(!!memoryObjects[ndx]);
					}

					if (m_config.order == TestConfig::ALLOC_FREE)
					{
						for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
						{
							const VkDeviceMemory mem = memoryObjects[memoryObjects.size() - 1 - ndx];

							vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
							memoryObjects[memoryObjects.size() - 1 - ndx] = (VkDeviceMemory)0;
						}
					}
					else
					{
						for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
						{
							const VkDeviceMemory mem = memoryObjects[ndx];

							vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
							memoryObjects[ndx] = (VkDeviceMemory)0;
						}
					}
				}
				else
				{
					for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
					{
						const VkMemoryAllocateInfo alloc =
						{
							VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
							DE_NULL,								// pNext
							allocationSize,							// allocationSize
							m_memoryTypeIndex						// memoryTypeIndex;
						};

						VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx]));
						TCU_CHECK(!!memoryObjects[ndx]);

						vkd.freeMemory(device, memoryObjects[ndx], (const VkAllocationCallbacks*)DE_NULL);
						memoryObjects[ndx] = (VkDeviceMemory)0;
					}
				}
			}
			catch (...)
			{
				for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
				{
					const VkDeviceMemory mem = memoryObjects[ndx];

					if (!!mem)
					{
						vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
						memoryObjects[ndx] = (VkDeviceMemory)0;
					}
				}

				throw;
			}
		}
	}
	catch (const tcu::TestError& error)
	{
		m_result.fail(error.getMessage());
	}

	m_memoryTypeIndex++;

	if (m_memoryTypeIndex < m_memoryProperties.memoryTypeCount)
		return tcu::TestStatus::incomplete();
	else
		return tcu::TestStatus(m_result.getResult(), m_result.getMessage());
}